

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_ls.c
# Opt level: O3

int CVodeSetEpsLin(void *cvode_mem,sunrealtype eplifac)

{
  int iVar1;
  CVLsMem cvls_mem;
  CVodeMem cv_mem;
  CVLsMem local_28;
  CVodeMem local_20;
  double local_18;
  
  local_18 = eplifac;
  iVar1 = cvLs_AccessLMem(cvode_mem,"CVodeSetEpsLin",&local_20,&local_28);
  if (iVar1 == 0) {
    if (0.0 <= local_18) {
      local_28->eplifac =
           (sunrealtype)
           (~-(ulong)(local_18 == 0.0) & (ulong)local_18 |
           -(ulong)(local_18 == 0.0) & 0x3fa999999999999a);
      iVar1 = 0;
    }
    else {
      iVar1 = -3;
      cvProcessError(local_20,-3,0x165,"CVodeSetEpsLin",
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_ls.c"
                     ,"eplifac < 0 illegal.");
    }
  }
  return iVar1;
}

Assistant:

int CVodeSetEpsLin(void* cvode_mem, sunrealtype eplifac)
{
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  int retval;

  /* access CVLsMem structure */
  retval = cvLs_AccessLMem(cvode_mem, __func__, &cv_mem, &cvls_mem);
  if (retval != CVLS_SUCCESS) { return (retval); }

  /* Check for legal eplifac */
  if (eplifac < ZERO)
  {
    cvProcessError(cv_mem, CVLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSG_LS_BAD_EPLIN);
    return (CVLS_ILL_INPUT);
  }

  cvls_mem->eplifac = (eplifac == ZERO) ? CVLS_EPLIN : eplifac;

  return (CVLS_SUCCESS);
}